

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryConcat(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  long lVar2;
  JavascriptNativeFloatArray *fArray;
  JavascriptNativeIntArray *pJVar3;
  uint32 uVar4;
  int32 rhs;
  uint idxArg_00;
  uint idxArg_01;
  TypeId *pTVar5;
  undefined8 uVar6;
  bool bVar7;
  int n;
  uint32 rhs_00;
  ScriptContext *pSVar8;
  Var *values;
  undefined4 *puVar9;
  ThreadContext *threadContext;
  JavascriptArray *pJVar10;
  ScriptConfiguration *this;
  Var pvVar11;
  CallInfo obj;
  JavascriptLibrary *pJVar12;
  double value;
  undefined *puStack_2f0;
  TypeId aTStack_2e8 [3];
  undefined1 local_2d9;
  JavascriptArray *local_2d8;
  JavascriptLibrary *local_2d0;
  JavascriptArray *local_2c8;
  JavascriptArray *local_2c0;
  JavascriptArray *local_2b8;
  JavascriptArray *local_2b0;
  JavascriptLibrary *local_2a8;
  JavascriptArray *local_2a0;
  JavascriptArray *local_298;
  JavascriptArray *local_290;
  JavascriptArray *local_288;
  JavascriptLibrary *local_280;
  JavascriptArray *local_278;
  JavascriptArray *local_270;
  undefined1 local_261;
  JavascriptNativeFloatArray *local_260;
  JavascriptNativeFloatArray *local_258;
  JavascriptNativeFloatArray *local_250;
  undefined1 local_241;
  JavascriptNativeIntArray *local_240;
  JavascriptNativeIntArray *local_238;
  JavascriptNativeIntArray *local_230;
  undefined1 local_223;
  undefined1 local_222;
  undefined1 local_221;
  JavascriptNativeIntArray *local_220;
  JavascriptNativeIntArray *local_218;
  JavascriptNativeIntArray *local_210;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  CallInfo local_200;
  Var local_1f8;
  undefined1 local_1e9;
  uint32 local_1e8;
  undefined1 local_1e1;
  int32 local_1e0;
  undefined1 local_1da;
  undefined1 local_1d9;
  double local_1d8;
  undefined1 local_1cb;
  undefined1 local_1ca;
  undefined1 local_1c9;
  uint32 local_1c8;
  uint32 local_1c4;
  Var local_1c0;
  uint32 local_1b4;
  uint32 local_1b0;
  uint32 local_1ac;
  int64 local_1a8;
  Var local_1a0;
  undefined1 local_191;
  ScriptConfiguration *local_190;
  undefined1 local_182;
  undefined1 local_181;
  uint32 local_180;
  uint32 local_17c;
  uint32 local_178;
  undefined1 local_172;
  undefined1 local_171;
  JavascriptArray *local_170;
  undefined1 local_161;
  JavascriptArray *local_160;
  size_t local_158;
  ScriptContext *local_150;
  ThreadContext *local_148;
  ScriptContext *local_140;
  undefined1 local_136;
  undefined1 local_135;
  CallFlags local_134;
  ThreadContext *local_130;
  JavascriptNativeFloatArray *pFArray;
  JavascriptNativeIntArray *pIntArray;
  JavascriptNativeFloatArray *nativeFloatArray;
  JavascriptNativeIntArray *nativeIntArray_1;
  JavascriptNativeIntArray *nativeIntArray;
  bool isArray;
  RecyclableObject *pDestObj;
  int32 local_d8;
  int32 int32Value_1;
  int32 int32Value;
  uint len_1;
  int64 len;
  JavascriptArray *pJStack_c0;
  BOOL isArray_1;
  JavascriptArray *pItemArray;
  Var aItem;
  uint idxArg;
  RecordOverflowPolicy destLengthOverflow;
  bool isFloat;
  bool isInt;
  TypeId *remoteTypeIds;
  JavascriptArray *pDestArray;
  uint32 cDestLength;
  undefined1 local_88 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  puStack_2f0 = (undefined *)0x10cb14c;
  function_local = (RecyclableObject *)callInfo;
  pSVar8 = RecyclableObject::GetScriptContext(function);
  puStack_2f0 = (undefined *)0x10cb154;
  local_130 = ScriptContext::GetThreadContext(pSVar8);
  puStack_2f0 = (undefined *)0x10cb164;
  pSVar8 = RecyclableObject::GetScriptContext(function);
  puStack_2f0 = (undefined *)0x10cb17c;
  ThreadContext::ProbeStack(local_130,0xc00,pSVar8,(PVOID)0x0);
  puStack_2f0 = (undefined *)0x10cb198;
  n = _count_args((CallInfo)function_local);
  puStack_2f0 = (undefined *)0x10cb1a6;
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  puStack_2f0 = (undefined *)0x10cb1c3;
  bVar7 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    puStack_2f0 = (undefined *)0x10cb1e1;
    Throw::LogAssert();
    puStack_2f0 = (undefined *)0x10cb1f1;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    puStack_2f0 = (undefined *)0x10cb216;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xe0b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puStack_2f0 = (undefined *)0x10cb22c;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  puStack_2f0 = (undefined *)0x10cb245;
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  puStack_2f0 = (undefined *)0x10cb24e;
  jsReentLock._24_8_ = RecyclableObject::GetScriptContext(function);
  puStack_2f0 = (undefined *)0x10cb25b;
  threadContext = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  puStack_2f0 = (undefined *)0x10cb267;
  JsReentLock::JsReentLock((JsReentLock *)local_88,threadContext);
  puStack_2f0 = (undefined *)0x10cb275;
  local_134 = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  puStack_2f0 = (undefined *)0x10cb288;
  local_135 = operator!(local_134);
  if (!(bool)local_135) {
    AssertCount = AssertCount + 1;
    puStack_2f0 = (undefined *)0x10cb2b2;
    Throw::LogAssert();
    puStack_2f0 = (undefined *)0x10cb2c4;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    puStack_2f0 = (undefined *)0x10cb2e9;
    local_136 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0xe0f,"(!(callInfo.Flags & CallFlags_New))",
                                    "!(callInfo.Flags & CallFlags_New)");
    if (!(bool)local_136) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puStack_2f0 = (undefined *)0x10cb331;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (((uint)scriptContext & 0xffffff) == 0) {
    puStack_2f0 = &UNK_010cb35f;
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec42,L"Array.prototype.concat");
  }
  pDestArray._0_4_ = 0;
  puStack_2f0 = (undefined *)0x10cb37f;
  local_140 = RecyclableObject::GetScriptContext(function);
  puStack_2f0 = (undefined *)0x10cb394;
  local_148 = ScriptContext::GetThreadContext(local_140);
  local_158 = (ulong)((uint)scriptContext & 0xffffff) * 8 + 0xc00;
  puStack_2f0 = (undefined *)0x10cb3bd;
  local_150 = RecyclableObject::GetScriptContext(function);
  puStack_2f0 = (undefined *)0x10cb3e4;
  ThreadContext::ProbeStackNoDispose(local_148,local_158,local_150,(PVOID)0x0);
  lVar2 = -(ulong)(((uint)scriptContext & 0xffffff) * 8 + 0xf & 0xfffffff0);
  _idxArg = (TypeId *)((long)aTStack_2e8 + lVar2);
  aItem._7_1_ = 1;
  aItem._6_1_ = 1;
  *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb427;
  ::Math::RecordOverflowPolicy::RecordOverflowPolicy((RecordOverflowPolicy *)((long)&aItem + 5));
  aItem._0_4_ = 0;
  do {
    idxArg_00 = (uint)aItem;
    if (((uint)scriptContext & 0xffffff) <= (uint)aItem) {
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb967;
      local_1e9 = ::Math::RecordOverflowPolicy::HasOverflowed
                            ((RecordOverflowPolicy *)((long)&aItem + 5));
      if ((bool)local_1e9) {
        pDestArray._0_4_ = 0xffffffff;
        aItem._7_1_ = 0;
        aItem._6_1_ = 0;
      }
      nativeIntArray._7_1_ = false;
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb9ae;
      JsReentLock::unlock((JsReentLock *)local_88);
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb9bb;
      pvVar11 = Arguments::operator[]((Arguments *)&scriptContext,0);
      uVar6 = jsReentLock._24_8_;
      local_1f8 = pvVar11;
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb9df;
      obj = (CallInfo)
            ArraySpeciesCreate<int>
                      (pvVar11,0,(ScriptContext *)uVar6,(bool *)0x0,(bool *)0x0,(bool *)0x0);
      local_200 = obj;
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb9ff;
      JsReentLock::relock((JsReentLock *)local_88);
      if (obj != (CallInfo)0x0) {
        *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cba1b;
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>((Var)obj);
        if ((aItem._7_1_ & 1) == 0) {
          if ((aItem._6_1_ & 1) == 0) {
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbb9b;
            local_223 = VarIs<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                                  ((RecyclableObject *)obj);
            if ((bool)local_223) {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbbb8;
              local_238 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                                    ((RecyclableObject *)obj);
              local_230 = local_238;
            }
            else {
              local_238 = (JavascriptNativeIntArray *)0x0;
            }
            pJVar3 = local_238;
            local_240 = local_238;
            if (local_238 == (JavascriptNativeIntArray *)0x0) {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbc30;
              local_241 = VarIs<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                                    ((RecyclableObject *)obj);
              if ((bool)local_241) {
                *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbc4d;
                local_258 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                                      ((RecyclableObject *)obj);
                local_250 = local_258;
              }
              else {
                local_258 = (JavascriptNativeFloatArray *)0x0;
              }
              fArray = local_258;
              local_260 = local_258;
              if (local_258 == (JavascriptNativeFloatArray *)0x0) {
                *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbcba;
                local_261 = IsNonES5Array((Var)obj);
                nativeIntArray._7_1_ = (bool)local_261;
              }
              else {
                *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbca3;
                JavascriptNativeFloatArray::ToVarArray(fArray);
                nativeIntArray._7_1_ = true;
              }
            }
            else {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbc0e;
              JavascriptNativeIntArray::ToVarArray(pJVar3);
              nativeIntArray._7_1_ = true;
            }
          }
          else {
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbac0;
            local_204 = VarIs<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                                  ((RecyclableObject *)obj);
            if ((bool)local_204) {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbadd;
              local_218 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                                    ((RecyclableObject *)obj);
              local_210 = local_218;
            }
            else {
              local_218 = (JavascriptNativeIntArray *)0x0;
            }
            pJVar3 = local_218;
            local_220 = local_218;
            if (local_218 == (JavascriptNativeIntArray *)0x0) {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbb4a;
              local_221 = VarIs<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                                    ((RecyclableObject *)obj);
              aItem._6_1_ = local_221;
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbb6c;
              local_222 = IsNonES5Array((Var)obj);
              nativeIntArray._7_1_ = (bool)local_222;
            }
            else {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbb33;
              JavascriptNativeIntArray::ToNativeFloatArray(pJVar3);
              nativeIntArray._7_1_ = true;
            }
          }
        }
        else {
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cba32;
          local_201 = VarIs<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                                ((RecyclableObject *)obj);
          if ((bool)local_201) {
            nativeIntArray._7_1_ = true;
          }
          else {
            aItem._7_1_ = 0;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cba62;
            local_202 = VarIs<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                                  ((RecyclableObject *)obj);
            aItem._6_1_ = local_202;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cba84;
            local_203 = IsNonES5Array((Var)obj);
            nativeIntArray._7_1_ = (bool)local_203;
          }
        }
      }
      uVar6 = jsReentLock._24_8_;
      if ((obj == (CallInfo)0x0) || (nativeIntArray._7_1_ != false)) {
        if ((aItem._7_1_ & 1) == 0) {
          if ((aItem._6_1_ & 1) == 0) {
            if (nativeIntArray._7_1_ == false) {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbefe;
              pJVar12 = ScriptContext::GetLibrary((ScriptContext *)uVar6);
              local_2d0 = pJVar12;
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbf19;
              local_2d8 = JavascriptLibrary::CreateArray(pJVar12,(uint32)pDestArray);
              local_2c8 = local_2d8;
            }
            else {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbedc;
              local_2c8 = VarTo<Js::JavascriptArray,Js::RecyclableObject>((RecyclableObject *)obj);
              local_2c0 = local_2c8;
            }
            pJVar10 = local_2c8;
            remoteTypeIds = (TypeId *)local_2c8;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbf4c;
            EnsureHead<void*>(pJVar10);
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbf57;
            JsReentLock::unlock((JsReentLock *)local_88);
            uVar6 = jsReentLock._24_8_;
            pTVar5 = _idxArg;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbf7b;
            ConcatArgsCallingHelper
                      ((RecyclableObject *)pJVar10,pTVar5,(Arguments *)&scriptContext,
                       (ScriptContext *)uVar6,(RecordOverflowPolicy *)((long)&aItem + 5));
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbf86;
            JsReentLock::MutateArrayObject((JsReentLock *)local_88);
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbf91;
            JsReentLock::relock((JsReentLock *)local_88);
          }
          else {
            if (nativeIntArray._7_1_ == false) {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbe1f;
              pJVar12 = ScriptContext::GetLibrary((ScriptContext *)uVar6);
              local_2a8 = pJVar12;
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbe3a;
              local_2b0 = (JavascriptArray *)
                          JavascriptLibrary::CreateNativeFloatArray(pJVar12,(uint32)pDestArray);
              local_2a0 = local_2b0;
            }
            else {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbdfd;
              local_2a0 = (JavascriptArray *)
                          VarTo<Js::JavascriptNativeFloatArray,Js::RecyclableObject>
                                    ((RecyclableObject *)obj);
              local_298 = local_2a0;
            }
            pJVar10 = local_2a0;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbe6d;
            EnsureHead<double>(pJVar10);
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbe78;
            JsReentLock::unlock((JsReentLock *)local_88);
            uVar6 = jsReentLock._24_8_;
            pTVar5 = _idxArg;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbe95;
            remoteTypeIds =
                 (TypeId *)
                 ConcatFloatArgs((JavascriptNativeFloatArray *)pJVar10,pTVar5,
                                 (Arguments *)&scriptContext,(ScriptContext *)uVar6);
            local_2b8 = (JavascriptArray *)remoteTypeIds;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbeb5;
            JsReentLock::MutateArrayObject((JsReentLock *)local_88);
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbec0;
            JsReentLock::relock((JsReentLock *)local_88);
          }
        }
        else {
          if (nativeIntArray._7_1_ == false) {
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbd33;
            pJVar12 = ScriptContext::GetLibrary((ScriptContext *)uVar6);
            local_280 = pJVar12;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbd4e;
            local_288 = (JavascriptArray *)
                        JavascriptLibrary::CreateNativeIntArray(pJVar12,(uint32)pDestArray);
            local_278 = local_288;
          }
          else {
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbd11;
            local_278 = (JavascriptArray *)
                        VarTo<Js::JavascriptNativeIntArray,Js::RecyclableObject>
                                  ((RecyclableObject *)obj);
            local_270 = local_278;
          }
          pJVar10 = local_278;
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbd81;
          EnsureHead<int>(pJVar10);
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbd8c;
          JsReentLock::unlock((JsReentLock *)local_88);
          uVar6 = jsReentLock._24_8_;
          pTVar5 = _idxArg;
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbda9;
          remoteTypeIds =
               (TypeId *)
               ConcatIntArgs((JavascriptNativeIntArray *)pJVar10,pTVar5,(Arguments *)&scriptContext,
                             (ScriptContext *)uVar6);
          local_290 = (JavascriptArray *)remoteTypeIds;
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbdc9;
          JsReentLock::MutateArrayObject((JsReentLock *)local_88);
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbdd4;
          JsReentLock::relock((JsReentLock *)local_88);
        }
        pcVar1 = *(code **)(*(undefined8 *)remoteTypeIds + 0x3a0);
        *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbfaa;
        (*pcVar1)();
        callInfo_local = (CallInfo)remoteTypeIds;
      }
      else {
        if (obj == (CallInfo)0x0) {
          AssertCount = AssertCount + 1;
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbfe4;
          Throw::LogAssert();
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cbff6;
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cc01b;
          local_2d9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0xef0,"(pDestObj)","pDestObj");
          if (!(bool)local_2d9) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cc041;
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cc054;
        JsReentLock::unlock((JsReentLock *)local_88);
        uVar6 = jsReentLock._24_8_;
        pTVar5 = _idxArg;
        *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cc078;
        ConcatArgsCallingHelper
                  ((RecyclableObject *)obj,pTVar5,(Arguments *)&scriptContext,(ScriptContext *)uVar6
                   ,(RecordOverflowPolicy *)((long)&aItem + 5));
        *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cc083;
        JsReentLock::MutateArrayObject((JsReentLock *)local_88);
        *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cc08e;
        JsReentLock::relock((JsReentLock *)local_88);
        callInfo_local = obj;
      }
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cc0ae;
      JsReentLock::~JsReentLock((JsReentLock *)local_88);
      return (Var)callInfo_local;
    }
    *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb45b;
    pJVar10 = (JavascriptArray *)Arguments::operator[]((Arguments *)&scriptContext,idxArg_00);
    local_160 = pJVar10;
    pItemArray = pJVar10;
    *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb47e;
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pJVar10);
    pJVar10 = pItemArray;
    *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb48c;
    local_161 = DynamicObject::IsAnyArray(pJVar10);
    pJVar10 = pItemArray;
    if ((bool)local_161) {
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb4af;
      pJVar10 = FromAnyArray(pJVar10);
      local_170 = pJVar10;
      pJStack_c0 = pJVar10;
      if ((aItem._6_1_ & 1) != 0) {
        *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb4db;
        local_171 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pJVar10);
        pJVar10 = pJStack_c0;
        if (!(bool)local_171) {
          aItem._7_1_ = 0;
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb502;
          local_172 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pJVar10);
          if (!(bool)local_172) {
            aItem._6_1_ = 0;
          }
        }
      }
      pJVar10 = pJStack_c0;
      local_17c = (uint32)pDestArray;
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb539;
      rhs_00 = ArrayObject::GetLength(&pJVar10->super_ArrayObject);
      uVar4 = local_17c;
      local_178 = rhs_00;
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb559;
      local_180 = UInt32Math::Add<Math::RecordOverflowPolicy>
                            (uVar4,rhs_00,(RecordOverflowPolicy *)((long)&aItem + 5));
      pDestArray._0_4_ = local_180;
    }
    else {
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb57b;
      JsReentLock::unlock((JsReentLock *)local_88);
      pJVar10 = pItemArray;
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb589;
      local_181 = Js::JavascriptOperators::IsArray(pJVar10);
      len._4_4_ = (uint)(byte)local_181;
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb5ac;
      JsReentLock::MutateArrayObject((JsReentLock *)local_88);
      *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb5b7;
      JsReentLock::relock((JsReentLock *)local_88);
      uVar6 = jsReentLock._24_8_;
      idxArg_01 = (uint)aItem;
      pJVar10 = pItemArray;
      if (len._4_4_ == 0) {
        if ((aItem._6_1_ & 1) != 0) {
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb7bd;
          local_1c9 = BoxConcatItem(pJVar10,idxArg_01,(ScriptContext *)uVar6);
          pJVar10 = pItemArray;
          if ((bool)local_1c9) {
            aItem._7_1_ = 0;
            aItem._6_1_ = 0;
          }
          else {
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb7f0;
            local_1ca = TaggedInt::Is(pJVar10);
            pJVar10 = pItemArray;
            if ((bool)local_1ca) {
              if ((aItem._7_1_ & 1) != 0) {
                *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb8c1;
                local_1e0 = TaggedInt::ToInt32(pJVar10);
                pDestObj._4_4_ = local_1e0;
                *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb8e1;
                local_1e1 = SparseArraySegment<int>::IsMissingItem((int *)((long)&pDestObj + 4));
                if ((bool)local_1e1) {
                  aItem._7_1_ = 0;
                }
              }
            }
            else {
              *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb814;
              local_1cb = JavascriptNumber::Is(pJVar10);
              pJVar10 = pItemArray;
              if ((bool)local_1cb) {
                if ((aItem._7_1_ & 1) != 0) {
                  *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb84d;
                  value = JavascriptNumber::GetValue(pJVar10);
                  local_1d8 = value;
                  *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb86b;
                  local_1d9 = JavascriptNumber::TryGetInt32Value<false>(value,&local_d8);
                  if ((bool)local_1d9) {
                    *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb88b;
                    local_1da = SparseArraySegment<int>::IsMissingItem(&local_d8);
                    if (!(bool)local_1da) goto LAB_010cb904;
                  }
                  aItem._7_1_ = 0;
                }
              }
              else {
                aItem._7_1_ = 0;
                aItem._6_1_ = 0;
              }
            }
          }
        }
LAB_010cb904:
        _idxArg[(uint)aItem] = TypeIds_Limit;
        *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb92f;
        local_1e8 = UInt32Math::Add<Math::RecordOverflowPolicy>
                              ((uint32)pDestArray,1,(RecordOverflowPolicy *)((long)&aItem + 5));
        pDestArray._0_4_ = local_1e8;
      }
      else {
        aItem._7_1_ = 0;
        aItem._6_1_ = 0;
        *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb5e0;
        local_182 = VarIs<Js::JavascriptProxy>(pJVar10);
        uVar6 = jsReentLock._24_8_;
        if (!(bool)local_182) {
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb601;
          this = ScriptContext::GetConfig((ScriptContext *)uVar6);
          local_190 = this;
          *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb616;
          local_191 = ScriptConfiguration::IsES6ToLengthEnabled(this);
          if ((bool)local_191) {
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb636;
            JsReentLock::unlock((JsReentLock *)local_88);
            uVar6 = jsReentLock._24_8_;
            pJVar10 = pItemArray;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb648;
            pvVar11 = Js::JavascriptOperators::OP_GetLength(pJVar10,(ScriptContext *)uVar6);
            uVar6 = jsReentLock._24_8_;
            local_1a0 = pvVar11;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb661;
            local_1a8 = JavascriptConversion::ToLength(pvVar11,(ScriptContext *)uVar6);
            _int32Value = local_1a8;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb681;
            JsReentLock::MutateArrayObject((JsReentLock *)local_88);
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb68c;
            JsReentLock::relock((JsReentLock *)local_88);
            local_1ac = (uint32)pDestArray;
            if (_int32Value < 0xffffffff) {
              local_1b0 = (uint32)_int32Value;
            }
            else {
              local_1b0 = 0xffffffff;
            }
            uVar4 = local_1b0;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb6dc;
            local_1b4 = UInt32Math::Add<Math::RecordOverflowPolicy>
                                  ((uint32)pDestArray,uVar4,
                                   (RecordOverflowPolicy *)((long)&aItem + 5));
            pDestArray._0_4_ = local_1b4;
          }
          else {
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb6fe;
            JsReentLock::unlock((JsReentLock *)local_88);
            uVar6 = jsReentLock._24_8_;
            pJVar10 = pItemArray;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb710;
            pvVar11 = Js::JavascriptOperators::OP_GetLength(pJVar10,(ScriptContext *)uVar6);
            uVar6 = jsReentLock._24_8_;
            local_1c0 = pvVar11;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb729;
            local_1c4 = JavascriptConversion::ToUInt32(pvVar11,(ScriptContext *)uVar6);
            int32Value_1 = local_1c4;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb746;
            JsReentLock::MutateArrayObject((JsReentLock *)local_88);
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb751;
            JsReentLock::relock((JsReentLock *)local_88);
            rhs = int32Value_1;
            *(undefined8 *)((long)aTStack_2e8 + lVar2 + -8) = 0x10cb76b;
            local_1c8 = UInt32Math::Add<Math::RecordOverflowPolicy>
                                  ((uint32)pDestArray,rhs,(RecordOverflowPolicy *)((long)&aItem + 5)
                                  );
            pDestArray._0_4_ = local_1c8;
          }
        }
        _idxArg[(uint)aItem] = TypeIds_Array;
      }
    }
    aItem._0_4_ = (uint)aItem + 1;
  } while( true );
}

Assistant:

Var JavascriptArray::EntryConcat(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Concat);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.concat"));
        }

        //
        // Compute the destination ScriptArray size:
        // - Each item, flattening only one level if a ScriptArray.
        //

        uint32 cDestLength = 0;
        JavascriptArray * pDestArray = NULL;

        PROBE_STACK_NO_DISPOSE(function->GetScriptContext(), Js::Constants::MinStackDefault + (args.Info.Count * sizeof(TypeId*)));
        TypeId* remoteTypeIds = (TypeId*)_alloca(args.Info.Count * sizeof(TypeId*));

        bool isInt = true;
        bool isFloat = true;
        ::Math::RecordOverflowPolicy destLengthOverflow;
        for (uint idxArg = 0; idxArg < args.Info.Count; idxArg++)
        {
            Var aItem = args[idxArg];
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(aItem);
#endif
            if (DynamicObject::IsAnyArray(aItem)) // Get JavascriptArray or ES5Array length
            {
                JavascriptArray * pItemArray = JavascriptArray::FromAnyArray(aItem);
                if (isFloat)
                {
                    if (!VarIs<JavascriptNativeIntArray>(pItemArray))
                    {
                        isInt = false;
                        if (!VarIs<JavascriptNativeFloatArray>(pItemArray))
                        {
                            isFloat = false;
                        }
                    }
                }
                cDestLength = UInt32Math::Add(cDestLength, pItemArray->GetLength(), destLengthOverflow);
            }
            else // Get remote array or object length
            {
                // We already checked for types derived from JavascriptArray. These are types that should behave like array
                // i.e. proxy to array and remote array.
                JS_REENTRANT(jsReentLock, BOOL isArray = JavascriptOperators::IsArray(aItem));
                if (isArray)
                {
                    // Don't try to preserve nativeness of remote arrays. The extra complexity is probably not
                    // worth it.
                    isInt = false;
                    isFloat = false;
                    if (!VarIs<JavascriptProxy>(aItem))
                    {
                        if (scriptContext->GetConfig()->IsES6ToLengthEnabled())
                        {
                            JS_REENTRANT(jsReentLock,
                                int64 len = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(aItem, scriptContext), scriptContext));
                            // clipping to MaxArrayLength will overflow when added to cDestLength which we catch below
                            cDestLength = UInt32Math::Add(cDestLength, len < MaxArrayLength ? (uint32)len : MaxArrayLength, destLengthOverflow);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock,
                                uint len = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetLength(aItem, scriptContext), scriptContext));
                            cDestLength = UInt32Math::Add(cDestLength, len, destLengthOverflow);
                        }
                    }
                    remoteTypeIds[idxArg] = TypeIds_Array; // Mark remote array, no matter remote JavascriptArray or ES5Array.
                }
                else
                {
                    if (isFloat)
                    {
                        if (BoxConcatItem(aItem, idxArg, scriptContext))
                        {
                            // A primitive will be boxed, so we have to create a var array for the result.
                            isInt = false;
                            isFloat = false;
                        }
                        else if (!TaggedInt::Is(aItem))
                        {
                            if (!JavascriptNumber::Is(aItem))
                            {
                                isInt = false;
                                isFloat = false;
                            }
                            else if (isInt)
                            {
                                int32 int32Value;
                                if(!JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(aItem), &int32Value) ||
                                    SparseArraySegment<int32>::IsMissingItem(&int32Value))
                                {
                                    isInt = false;
                                }
                            }
                        }
                        else if(isInt)
                        {
                            int32 int32Value = TaggedInt::ToInt32(aItem);
                            if(SparseArraySegment<int32>::IsMissingItem(&int32Value))
                            {
                                isInt = false;
                            }
                        }
                    }

                    remoteTypeIds[idxArg] = TypeIds_Limit;
                    cDestLength = UInt32Math::Add(cDestLength, 1, destLengthOverflow);
                }
            }
        }
        if (destLengthOverflow.HasOverflowed())
        {
            cDestLength = MaxArrayLength;
            isInt = false;
            isFloat = false;
        }

        //
        // Create the destination array
        //
        RecyclableObject* pDestObj = nullptr;
        bool isArray = false;

        JS_REENTRANT_NO_MUTATE(jsReentLock, pDestObj = ArraySpeciesCreate(args[0], 0, scriptContext));

        if (pDestObj)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pDestObj);
#endif
            // Check the thing that species create made. If it's a native array that can't handle the source
            // data, convert it. If it's a more conservative kind of array than the source data, indicate that
            // so that the data will be converted on copy.
            if (isInt)
            {
                if (VarIs<JavascriptNativeIntArray>(pDestObj))
                {
                    isArray = true;
                }
                else
                {
                    isInt = false;
                    isFloat = VarIs<JavascriptNativeFloatArray>(pDestObj);
                    isArray = JavascriptArray::IsNonES5Array(pDestObj);
                }
            }
            else if (isFloat)
            {
                JavascriptNativeIntArray *nativeIntArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(pDestObj);
                if (nativeIntArray)
                {
                    JavascriptNativeIntArray::ToNativeFloatArray(nativeIntArray);
                    isArray = true;
                }
                else
                {
                    isFloat = VarIs<JavascriptNativeFloatArray>(pDestObj);
                    isArray = JavascriptArray::IsNonES5Array(pDestObj);
                }
            }
            else
            {
                JavascriptNativeIntArray *nativeIntArray = JavascriptOperators::TryFromVar<Js::JavascriptNativeIntArray>(pDestObj);
                if (nativeIntArray)
                {
                    JavascriptNativeIntArray::ToVarArray(nativeIntArray);
                    isArray = true;
                }
                else
                {
                    JavascriptNativeFloatArray *nativeFloatArray = JavascriptOperators::TryFromVar<Js::JavascriptNativeFloatArray>(pDestObj);
                    if (nativeFloatArray)
                    {
                        JavascriptNativeFloatArray::ToVarArray(nativeFloatArray);
                        isArray = true;
                    }
                    else
                    {
                        isArray = JavascriptArray::IsNonES5Array(pDestObj);
                    }
                }
            }
        }

        if (pDestObj == nullptr || isArray)
        {
            if (isInt)
            {
                JavascriptNativeIntArray *pIntArray = isArray ? VarTo<JavascriptNativeIntArray>(pDestObj) : scriptContext->GetLibrary()->CreateNativeIntArray(cDestLength);
                pIntArray->EnsureHead<int32>();

                JS_REENTRANT(jsReentLock, pDestArray = ConcatIntArgs(pIntArray, remoteTypeIds, args, scriptContext));
            }
            else if (isFloat)
            {
                JavascriptNativeFloatArray *pFArray = isArray ? VarTo<JavascriptNativeFloatArray>(pDestObj) : scriptContext->GetLibrary()->CreateNativeFloatArray(cDestLength);
                pFArray->EnsureHead<double>();

                JS_REENTRANT(jsReentLock, pDestArray = ConcatFloatArgs(pFArray, remoteTypeIds, args, scriptContext));
            }
            else
            {

                pDestArray = isArray ?  VarTo<JavascriptArray>(pDestObj) : scriptContext->GetLibrary()->CreateArray(cDestLength);
                // if the constructor has changed then we no longer specialize for ints and floats
                pDestArray->EnsureHead<Var>();

                JS_REENTRANT(jsReentLock, ConcatArgsCallingHelper(pDestArray, remoteTypeIds, args, scriptContext, destLengthOverflow));
            }

            //
            // Return the new array instance.
            //

#ifdef VALIDATE_ARRAY
            pDestArray->ValidateArray();
#endif

            return pDestArray;
        }

        Assert(pDestObj);
        JS_REENTRANT(jsReentLock, ConcatArgsCallingHelper(pDestObj, remoteTypeIds, args, scriptContext, destLengthOverflow));

        return pDestObj;
        JIT_HELPER_END(Array_Concat);
    }